

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Matcher::MatchLeadingTrailingSpaces
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset)

{
  uint64 *puVar1;
  Char CVar2;
  GroupInfo *pGVar3;
  Type pRVar4;
  Program *pPVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  CharCount CVar10;
  ulong uVar11;
  uint uVar12;
  
  if (((this->program).ptr)->numGroups == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) goto LAB_00f00992;
    *puVar8 = 0;
  }
  pGVar3 = (this->groupInfos).ptr;
  if (inputLength < offset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ec,"(offset <= inputLength)","offset <= inputLength");
    if (!bVar7) goto LAB_00f00992;
    *puVar8 = 0;
  }
  if ((((this->program).ptr)->flags & MultilineRegexFlag) != NoRegexFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ed,"((program->flags & MultilineRegexFlag) == 0)",
                       "(program->flags & MultilineRegexFlag) == 0");
    if (!bVar7) goto LAB_00f00992;
    *puVar8 = 0;
  }
  if (offset < inputLength) {
    CVar10 = offset;
    if (offset == 0) {
      pRVar4 = this->stats;
      uVar9 = 0;
      do {
        CVar2 = input[uVar9];
        uVar11 = (ulong)(ushort)CVar2;
        if (uVar11 < 0x100) {
          if ((ASCIIChars::classes[uVar11] & 4) == 0) goto LAB_00f00854;
        }
        else if (((10 < (ushort)(CVar2 + L'\xe000') && uVar11 != 0x1680) &&
                 (((0x37 < (ushort)CVar2 - 0x2028 ||
                   ((0x80000000000083U >> ((ulong)((ushort)CVar2 - 0x2028) & 0x3f) & 1) == 0)) &&
                  (CVar2 != L'\xfeff')))) && (CVar2 != L'\x3000')) goto LAB_00f00854;
        if (pRVar4 != (Type)0x0) {
          puVar1 = &pRVar4->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (inputLength != uVar9);
      uVar9 = (ulong)inputLength;
LAB_00f00854:
      CVar10 = (CharCount)uVar9;
      if ((((this->program).ptr)->rep).boiLiteral2.literal <= CVar10) {
        offset = 0;
        goto LAB_00f00978;
      }
    }
    uVar12 = inputLength - 1;
    offset = inputLength;
    if (CVar10 <= uVar12) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        CVar2 = input[uVar12];
        uVar9 = (ulong)(ushort)CVar2;
        if (uVar9 < 0x100) {
          if ((ASCIIChars::classes[uVar9] & 4) == 0) break;
        }
        else if (((10 < (ushort)(CVar2 + L'\xe000') && uVar9 != 0x1680) &&
                 ((0x37 < (ushort)CVar2 - 0x2028 ||
                  ((0x80000000000083U >> ((ulong)((ushort)CVar2 - 0x2028) & 0x3f) & 1) == 0)))) &&
                ((CVar2 != L'\xfeff' && (CVar2 != L'\x3000')))) break;
        bVar7 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x1515,"(offset > 0)","offset > 0");
          if (!bVar7) goto LAB_00f00992;
          *puVar8 = 0;
        }
        if (this->stats != (Type)0x0) {
          puVar1 = &this->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
      } while (CVar10 <= uVar12);
      offset = uVar12 + 1;
    }
    CVar10 = inputLength - offset;
    if (CVar10 < (((this->program).ptr)->rep).leadingTrailingSpaces.endMinMatch) {
LAB_00f00971:
      CVar10 = 0xffffffff;
      bVar7 = false;
      goto LAB_00f0097f;
    }
  }
  else {
    if (offset != inputLength) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x14f1,"(offset == inputLength)","offset == inputLength");
      if (!bVar7) {
LAB_00f00992:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar8 = 0;
    }
    pPVar5 = (this->program).ptr;
    if ((pPVar5->rep).leadingTrailingSpaces.endMinMatch == 0) {
      CVar10 = 0;
    }
    else {
      CVar10 = 0;
      if ((offset != 0) || ((pPVar5->rep).boiLiteral2.literal != 0)) goto LAB_00f00971;
    }
  }
LAB_00f00978:
  pGVar3->offset = offset;
  bVar7 = true;
LAB_00f0097f:
  pGVar3->length = CVar10;
  return bVar7;
}

Assistant:

inline bool Matcher::MatchLeadingTrailingSpaces(const Char* const input, const CharCount inputLength, CharCount offset)
    {
        GroupInfo* const info = GroupIdToGroupInfo(0);
        Assert(offset <= inputLength);
        Assert((program->flags & MultilineRegexFlag) == 0);

        if (offset >= inputLength)
        {
            Assert(offset == inputLength);
            if (program->rep.leadingTrailingSpaces.endMinMatch == 0 ||
                (offset == 0 && program->rep.leadingTrailingSpaces.beginMinMatch == 0))
            {
                info->offset = offset;
                info->length = 0;
                return true;
            }
            info->Reset();
            return false;
        }

        const StandardChars<Char> &stdchrs = *standardChars;
        if (offset == 0)
        {
            while (offset < inputLength && stdchrs.IsWhitespaceOrNewline(input[offset]))
            {
                offset++;
#if ENABLE_REGEX_CONFIG_OPTIONS
                CompStats();
#endif
            }
            if (offset >= program->rep.leadingTrailingSpaces.beginMinMatch)
            {
                info->offset = 0;
                info->length = offset;
                return true;
            }
        }

        Assert(inputLength > 0);
        const CharCount initOffset = offset;
        offset = inputLength - 1;
        while (offset >= initOffset && stdchrs.IsWhitespaceOrNewline(input[offset]))
        {
            // This can never underflow since initOffset > 0
            Assert(offset > 0);
            offset--;
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
        }
        offset++;
        CharCount length = inputLength - offset;
        if (length >= program->rep.leadingTrailingSpaces.endMinMatch)
        {
            info->offset = offset;
            info->length = length;
            return true;
        }
        info->Reset();
        return false;
    }